

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O0

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
::WorkerQueue(WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
              *this,int numWorkers,
             WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *args,Database<Protein> *args_1,SearchParams<Protein> *args_2)

{
  uint local_8c;
  type local_58;
  thread local_50;
  uint local_44;
  uint local_40;
  int i;
  uint actualWorkers;
  SearchParams<Protein> *local_30;
  SearchParams<Protein> *args_local_2;
  Database<Protein> *args_local_1;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *args_local;
  WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
  *pWStack_10;
  int numWorkers_local;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_30 = args_2;
  args_local_2 = (SearchParams<Protein> *)args_1;
  args_local_1 = (Database<Protein> *)args;
  args_local._4_4_ = numWorkers;
  pWStack_10 = this;
  std::deque<std::thread,_std::allocator<std::thread>_>::deque
            ((deque<std::thread,_std::allocator<std::thread>_> *)this);
  std::condition_variable::condition_variable((condition_variable *)(this + 0x50));
  std::mutex::mutex((mutex *)(this + 0x80));
  std::atomic<bool>::atomic((atomic<bool> *)(this + 0xa8),false);
  std::atomic<int>::atomic((atomic<int> *)(this + 0xac),0);
  std::
  queue<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::deque<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::allocator<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>>>>
  ::
  queue<std::deque<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::allocator<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>>>,void>
            ((queue<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::deque<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::allocator<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>>>>
              *)(this + 0xb0));
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::deque((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
           *)(this + 0x110));
  if ((int)args_local._4_4_ < 1) {
    local_8c = std::thread::hardware_concurrency();
  }
  else {
    local_8c = args_local._4_4_;
  }
  local_40 = local_8c;
  for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
    local_58.this =
         (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)this;
    std::thread::
    thread<WorkerQueue<QueryDatabaseSearcherWorker<Protein>,std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*,Database<Protein>const*,SearchParams<Protein>const&>::WorkerQueue(int,WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*,Database<Protein>const*,SearchParams<Protein>const&)::_lambda(WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*&&,Database<Protein>const*&&,SearchParams<Protein>const&)_1_,WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*&,Database<Protein>const*&,SearchParams<Protein>const&,void>
              (&local_50,&local_58,
               (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                **)&args_local_1,(Database<Protein> **)&args_local_2,local_30);
    std::deque<std::thread,_std::allocator<std::thread>_>::push_back
              ((deque<std::thread,_std::allocator<std::thread>_> *)this,&local_50);
    std::thread::~thread(&local_50);
  }
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }